

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall perfetto::TraceWriterImpl::~TraceWriterImpl(TraceWriterImpl *this)

{
  _Any_data local_28;
  undefined8 local_18;
  undefined8 uStack_10;
  
  (this->super_TraceWriter).super_TraceWriterBase._vptr_TraceWriterBase =
       (_func_int **)&PTR__TraceWriterImpl_00408768;
  (this->super_Delegate)._vptr_Delegate = (_func_int **)&PTR__TraceWriterImpl_004087b0;
  if (((this->cur_chunk_).begin_ != (uint8_t *)0x0) && ((this->cur_chunk_).size_ != 0)) {
    protozero::Message::Finalize
              ((Message *)
               (this->cur_packet_)._M_t.
               super___uniq_ptr_impl<protozero::RootMessage<perfetto::protos::pbzero::TracePacket>,_std::default_delete<protozero::RootMessage<perfetto::protos::pbzero::TracePacket>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_protozero::RootMessage<perfetto::protos::pbzero::TracePacket>_*,_std::default_delete<protozero::RootMessage<perfetto::protos::pbzero::TracePacket>_>_>
               .
               super__Head_base<0UL,_protozero::RootMessage<perfetto::protos::pbzero::TracePacket>_*,_false>
               ._M_head_impl);
    local_28._M_unused._M_object = (void *)0x0;
    local_28._8_8_ = 0;
    local_18 = 0;
    uStack_10 = 0;
    (*(this->super_TraceWriter).super_TraceWriterBase._vptr_TraceWriterBase[3])(this);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_28);
  }
  SharedMemoryArbiterImpl::ReleaseWriterID(this->shmem_arbiter_,this->id_);
  std::_Fwd_list_base<perfetto::Patch,_std::allocator<perfetto::Patch>_>::~_Fwd_list_base
            ((_Fwd_list_base<perfetto::Patch,_std::allocator<perfetto::Patch>_> *)&this->patch_list_
            );
  std::
  unique_ptr<protozero::RootMessage<perfetto::protos::pbzero::TracePacket>,_std::default_delete<protozero::RootMessage<perfetto::protos::pbzero::TracePacket>_>_>
  ::~unique_ptr(&this->cur_packet_);
  protozero::ScatteredStreamWriter::~ScatteredStreamWriter(&this->protobuf_stream_writer_);
  TraceWriter::~TraceWriter(&this->super_TraceWriter);
  return;
}

Assistant:

TraceWriterImpl::~TraceWriterImpl() {
  if (cur_chunk_.is_valid()) {
    cur_packet_->Finalize();
    Flush();
  }
  // This call may cause the shared memory arbiter (and the underlying memory)
  // to get asynchronously deleted if this was the last trace writer targeting
  // the arbiter and the arbiter was marked for shutdown.
  shmem_arbiter_->ReleaseWriterID(id_);
}